

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O2

void __thiscall
utObjImportExport_issue1923_vertex_color_Test_Test::
~utObjImportExport_issue1923_vertex_color_Test_Test
          (utObjImportExport_issue1923_vertex_color_Test_Test *this)

{
  AbstractImportExportBase::~AbstractImportExportBase((AbstractImportExportBase *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( utObjImportExport, issue1923_vertex_color_Test ) {
    ::Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/OBJ/cube_with_vertexcolors_uni.obj", aiProcess_ValidateDataStructure );
    EXPECT_NE( nullptr, scene );

    scene = importer.GetOrphanedScene();

#ifndef ASSIMP_BUILD_NO_EXPORT
    ::Assimp::Exporter exporter;
    const aiExportDataBlob* blob = exporter.ExportToBlob( scene, "obj");
    EXPECT_NE( nullptr, blob );

    const aiScene *sceneReImport = importer.ReadFileFromMemory( blob->data, blob->size, aiProcess_ValidateDataStructure );
    EXPECT_NE( nullptr, scene );

    SceneDiffer differ;
    EXPECT_TRUE( differ.isEqual( scene, sceneReImport ) );
#endif // ASSIMP_BUILD_NO_EXPORT

    delete scene;
}